

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

void __thiscall libtorrent::http_parser::http_parser(http_parser *this,int flags)

{
  int flags_local;
  http_parser *this_local;
  
  this->m_recv_pos = 0;
  std::__cxx11::string::string((string *)&this->m_method);
  std::__cxx11::string::string((string *)&this->m_path);
  std::__cxx11::string::string((string *)&this->m_protocol);
  std::__cxx11::string::string((string *)&this->m_server_message);
  this->m_content_length = -1;
  this->m_range_start = -1;
  this->m_range_end = -1;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap(&this->m_header);
  span<const_char>::span(&this->m_recv_buffer);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (&this->m_chunked_ranges);
  this->m_cur_chunk_end = -1;
  this->m_status_code = -1;
  this->m_chunk_header_size = 0;
  this->m_partial_chunk_header = 0;
  this->m_flags = flags;
  this->m_body_start_pos = 0;
  this->m_state = read_status;
  this->m_connection_close = false;
  this->m_chunked_encoding = false;
  this->m_finished = false;
  return;
}

Assistant:

http_parser::http_parser(int const flags) : m_flags(flags) {}